

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Apply * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Apply>(Allocator *this,Apply *ast)

{
  Apply *this_00;
  Apply *in_RSI;
  Apply *r;
  Apply *in_stack_ffffffffffffffe8;
  
  this_00 = (Apply *)operator_new(0xf8);
  Apply::Apply(in_RSI,in_stack_ffffffffffffffe8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }